

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_anomaly_test.cc
# Opt level: O0

void read_failure_test(void)

{
  fdb_doc *doc_00;
  void *pvVar1;
  void *pvVar2;
  undefined8 uVar3;
  long lVar4;
  fdb_status fVar5;
  int iVar6;
  anomalous_callbacks *paVar7;
  size_t *__s;
  size_t sVar8;
  size_t asStackY_e70 [2];
  undefined8 uStackY_e60;
  fdb_commit_opt_t fStackY_e59;
  void *in_stack_fffffffffffff1a8;
  anomalous_callbacks *in_stack_fffffffffffff1b0;
  long alStack_e48 [66];
  undefined8 auStack_c38 [231];
  undefined8 uStack_500;
  bool local_4f1;
  long *local_4f0;
  size_t *local_4e8;
  size_t local_4e0;
  char *local_4d8;
  size_t local_4d0;
  char *local_4c8;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  fail_ctx_t fail_ctx;
  anomalous_callbacks *read_fail_cb;
  char temp [256];
  char bodybuf [256];
  char metabuf [256];
  char *keybuf;
  fdb_doc *pfStack_88;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int keylen_limit;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  uStack_500 = 0x1062f8;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  uStack_500 = 0x106305;
  memleak_start();
  uStackY_e60 = 0x10632e;
  paVar7 = get_default_anon_cbs();
  paVar7->pread_cb = pread_failure_cb;
  uStackY_e60 = 0x106368;
  system("rm -rf  anomaly_test* > errorlog.txt");
  uStackY_e60 = 0x10637e;
  filemgr_ops_anomalous_init(in_stack_fffffffffffff1b0,in_stack_fffffffffffff1a8);
  uStackY_e60 = 0x106394;
  fdb_get_default_config();
  uStackY_e60 = 0x1063a0;
  fdb_get_default_kvs_config();
  lVar4 = -((long)(kvs_config.custom_cmp_param._4_4_ + -0x100) + 0xfU & 0xfffffffffffffff0);
  __s = (size_t *)((long)alStack_e48 + lVar4 + -0x10);
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106407;
  fVar5 = fdb_open(*(fdb_file_handle ***)((long)auStack_c38 + lVar4 + 0x10),
                   *(char **)((long)auStack_c38 + lVar4 + 8),
                   *(fdb_config **)((long)auStack_c38 + lVar4));
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10643a;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf2);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10646e;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0xf2,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106484;
  fVar5 = fdb_kvs_open_default
                    (*(fdb_file_handle **)((long)alStack_e48 + lVar4 + -8),(fdb_kvs_handle **)*__s,
                     *(fdb_kvs_config **)((long)&stack0xfffffffffffff1a0 + lVar4));
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1064b7;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf4);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1064eb;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0xf4,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106504;
  fVar5 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"read_failure_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106537;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0xf8);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10656b;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0xf8,"void read_failure_test()");
    }
  }
  for (n = 0; n < 300; n = n + 1) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106598;
    sprintf((char *)__s,"key%d",(ulong)(uint)n);
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1065b0;
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1065c8;
    sprintf(temp + 0xf8,"body%d",(ulong)(uint)n);
    local_4f0 = alStack_e48 + (long)n + -2;
    local_4e8 = __s;
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1065f8;
    local_4e0 = strlen((char *)__s);
    local_4d8 = bodybuf + 0xf8;
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106619;
    local_4d0 = strlen(bodybuf + 0xf8);
    local_4c8 = temp + 0xf8;
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10663a;
    sVar8 = strlen(temp + 0xf8);
    *(size_t *)((long)asStackY_e70 + lVar4 + 8) = sVar8;
    *(undefined8 *)((long)asStackY_e70 + lVar4) = 0x106671;
    fdb_doc_create(*(fdb_doc ***)((long)alStack_e48 + lVar4),
                   *(void **)((long)alStack_e48 + lVar4 + -8),*__s,
                   *(void **)((long)&stack0xfffffffffffff1a0 + lVar4),
                   *(size_t *)((long)asStackY_e70 + lVar4 + 8),
                   *(void **)((long)asStackY_e70 + lVar4),
                   *(size_t *)((long)alStack_e48 + lVar4 + 0x18));
    doc_00 = (fdb_doc *)alStack_e48[(long)n + -2];
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10668a;
    fVar5 = fdb_set((fdb_kvs_handle *)doc,doc_00);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1066bd;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x102);
      read_failure_test::__test_pass = 0;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1066f1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,0x102,"void read_failure_test()");
      }
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10670e;
  fVar5 = fdb_commit((fdb_file_handle *)*__s,(&fStackY_e59)[lVar4]);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106741;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x107);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106775;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x107,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106780;
  fdb_kvs_close((fdb_kvs_handle *)*__s);
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106789;
  fdb_close((fdb_file_handle *)*__s);
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1067ac;
  fVar5 = fdb_open(*(fdb_file_handle ***)((long)auStack_c38 + lVar4 + 0x10),
                   *(char **)((long)auStack_c38 + lVar4 + 8),
                   *(fdb_config **)((long)auStack_c38 + lVar4));
  if ((fVar5 != FDB_RESULT_READ_FAIL) && (fVar5 != FDB_RESULT_SB_READ_FAIL)) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1067ec;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x10e);
    read_failure_test::__test_pass = 0;
    local_4f1 = true;
    if (fVar5 != FDB_RESULT_READ_FAIL) {
      local_4f1 = fVar5 == FDB_RESULT_SB_READ_FAIL;
    }
    if (local_4f1 == false) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106844;
      __assert_fail("status == FDB_RESULT_READ_FAIL || status == FDB_RESULT_SB_READ_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x10e,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10686e;
  fVar5 = fdb_open(*(fdb_file_handle ***)((long)auStack_c38 + lVar4 + 0x10),
                   *(char **)((long)auStack_c38 + lVar4 + 8),
                   *(fdb_config **)((long)auStack_c38 + lVar4));
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1068a1;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x113);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1068d5;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x113,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1068eb;
  fVar5 = fdb_kvs_open_default
                    (*(fdb_file_handle **)((long)alStack_e48 + lVar4 + -8),(fdb_kvs_handle **)*__s,
                     *(fdb_kvs_config **)((long)&stack0xfffffffffffff1a0 + lVar4));
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10691e;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x115);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106952;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x115,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10696b;
  fVar5 = fdb_set_log_callback((fdb_kvs_handle *)doc,logCallbackFunc,"read_failure_test");
  if (fVar5 != FDB_RESULT_SUCCESS) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x10699e;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x119);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x1069d2;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x119,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)asStackY_e70 + lVar4 + 8) = 0;
  *(undefined8 *)((long)asStackY_e70 + lVar4) = 0x106a26;
  fdb_doc_create(*(fdb_doc ***)((long)alStack_e48 + lVar4),
                 *(void **)((long)alStack_e48 + lVar4 + -8),*__s,
                 *(void **)((long)&stack0xfffffffffffff1a0 + lVar4),
                 *(size_t *)((long)asStackY_e70 + lVar4 + 8),*(void **)((long)asStackY_e70 + lVar4),
                 *(size_t *)((long)alStack_e48 + lVar4 + 0x18));
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106a37;
  fVar5 = fdb_get((fdb_kvs_handle *)doc,pfStack_88);
  if (fVar5 != FDB_RESULT_READ_FAIL) {
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106a6a;
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
            ,0x120);
    read_failure_test::__test_pass = 0;
    if (fVar5 != FDB_RESULT_READ_FAIL) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106a9e;
      __assert_fail("status == FDB_RESULT_READ_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x120,"void read_failure_test()");
    }
  }
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106aa9;
  fdb_doc_free(*(fdb_doc **)((long)&stack0xfffffffffffff1a0 + lVar4));
  n = 0;
  while( true ) {
    if (299 < n) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106cc6;
      fdb_kvs_close((fdb_kvs_handle *)*__s);
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106ccf;
      fdb_close((fdb_file_handle *)*__s);
      for (n = 0; n < 300; n = n + 1) {
        *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106cef;
        fdb_doc_free(*(fdb_doc **)((long)&stack0xfffffffffffff1a0 + lVar4));
      }
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106cff;
      fdb_shutdown();
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106d04;
      memleak_end();
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106d25;
      sprintf((char *)&read_fail_cb,"read failure test: %d failures out of %d reads",0,0);
      if (read_failure_test::__test_pass == 0) {
        *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106d6e;
        fprintf(_stderr,"%s FAILED\n",&read_fail_cb);
      }
      else {
        *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106d4d;
        fprintf(_stderr,"%s PASSED\n",&read_fail_cb);
      }
      return;
    }
    *(undefined8 *)((long)asStackY_e70 + lVar4 + 8) = 0;
    *(undefined8 *)((long)asStackY_e70 + lVar4) = 0x106b0c;
    fdb_doc_create(*(fdb_doc ***)((long)alStack_e48 + lVar4),
                   *(void **)((long)alStack_e48 + lVar4 + -8),*__s,
                   *(void **)((long)&stack0xfffffffffffff1a0 + lVar4),
                   *(size_t *)((long)asStackY_e70 + lVar4 + 8),
                   *(void **)((long)asStackY_e70 + lVar4),
                   *(size_t *)((long)alStack_e48 + lVar4 + 0x18));
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106b1d;
    fVar5 = fdb_get((fdb_kvs_handle *)doc,pfStack_88);
    if (fVar5 != FDB_RESULT_SUCCESS) {
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106b50;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,299);
      read_failure_test::__test_pass = 0;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106b84;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                      ,299,"void read_failure_test()");
      }
    }
    pvVar1 = pfStack_88->meta;
    pvVar2 = *(void **)(alStack_e48[(long)n + -2] + 0x38);
    sVar8 = pfStack_88->metalen;
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106bab;
    iVar6 = memcmp(pvVar1,pvVar2,sVar8);
    if (iVar6 != 0) break;
    pvVar1 = pfStack_88->body;
    pvVar2 = *(void **)(alStack_e48[(long)n + -2] + 0x40);
    sVar8 = pfStack_88->bodylen;
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106c3b;
    iVar6 = memcmp(pvVar1,pvVar2,sVar8);
    if (iVar6 != 0) {
      uVar3 = *(undefined8 *)(alStack_e48[(long)n + -2] + 0x40);
      pvVar1 = pfStack_88->body;
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106c7d;
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",uVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
              ,0x12d);
      read_failure_test::__test_pass = 0;
      *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106ca6;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                    ,0x12d,"void read_failure_test()");
    }
    *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106caf;
    fdb_doc_free(*(fdb_doc **)((long)&stack0xfffffffffffff1a0 + lVar4));
    n = n + 1;
  }
  uVar3 = *(undefined8 *)(alStack_e48[(long)n + -2] + 0x38);
  pvVar1 = pfStack_88->meta;
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106bed;
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",uVar3,pvVar1,
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
          ,300);
  read_failure_test::__test_pass = 0;
  *(undefined8 *)((long)&stack0xfffffffffffff1a0 + lVar4) = 0x106c16;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/anomaly/fdb_anomaly_test.cc"
                ,300,"void read_failure_test()");
}

Assistant:

void read_failure_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n=300;
    int keylen_limit;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_status status;

    char *keybuf;
    char metabuf[256], bodybuf[256], temp[256];
    // Get the default callbacks which result in normal operation for other ops
    struct anomalous_callbacks *read_fail_cb = get_default_anon_cbs();
    fail_ctx_t fail_ctx;
    memset(&fail_ctx, 0, sizeof(fail_ctx_t));

    // Modify the pread callback to redirect to test-specific function
    read_fail_cb->pread_cb = &pread_failure_cb;

    // remove previous anomaly_test files
    r = system(SHELL_DEL" anomaly_test* > errorlog.txt");
    (void)r;

    // Reset anomalous behavior stats..
    filemgr_ops_anomalous_init(read_fail_cb, &fail_ctx);

    fail_ctx.start_failing_after = 1000; // some large value

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.purging_interval = 0;
    fconfig.compaction_threshold = 0;

    keylen_limit = fconfig.blocksize - 256;
    keybuf = alca(char, keylen_limit);

    // open db
    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    fdb_kvs_close(db);
    fdb_close(dbfile);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_READ_FAIL || status == FDB_RESULT_SB_READ_FAIL);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation

    status = fdb_open(&dbfile, "./anomaly_test1", &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "read_failure_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fail_ctx.start_failing_after = fail_ctx.num_ops; // immediately fail
    i = 0;
    fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
    status = fdb_get(db, rdoc);

    TEST_CHK(status == FDB_RESULT_READ_FAIL);
    // free result document
    fdb_doc_free(rdoc);

    fail_ctx.start_failing_after = fail_ctx.num_ops+1000; //normal operation
    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(temp, "read failure test: %d failures out of %d reads",
            fail_ctx.num_fails, fail_ctx.num_ops);

    TEST_RESULT(temp);
}